

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Check<signed_char,1,false,3u>
          (StorageAndSubImageTest *this)

{
  ulong uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ulong uVar5;
  bool bVar6;
  allocator_type local_21;
  vector<signed_char,_std::allocator<signed_char>_> result;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&result,0x18,&local_21);
  (**(code **)(lVar4 + 0xff0))(0xcf5,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8e5);
  (**(code **)(lVar4 + 0xff0))(0xd05,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8e8);
  (**(code **)(lVar4 + 0x1228))
            (0,0,0x18,1,0x8d94,0x1400,0x18,
             result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8fd);
  if (*result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
       super__Vector_impl_data._M_start == '\0') {
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (uVar5 == 0x17) break;
      uVar1 = uVar5 + 1;
    } while (result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5 + 1] == ""[uVar5 + 1]);
    bVar6 = 0x16 < uVar5;
  }
  else {
    bVar6 = false;
  }
  operator_delete(result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage -
                  (long)result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                        .super__Vector_impl_data._M_start);
  return bVar6;
}

Assistant:

bool StorageAndSubImageTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	glw::GLuint fbo_size_x = 0;

	switch (D)
	{
	case 1:
		fbo_size_x = 2;
		break;
	case 2:
		fbo_size_x = 2 * 3;
		break;
	case 3:
		fbo_size_x = 2 * 3 * 4;
		break;
	default:
		throw 0;
	}

	gl.readnPixels(0, 0, fbo_size_x, 1, Format<S, N>(), Type<T>(), TestReferenceDataSize<T, S, D>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}